

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void __thiscall
doctest::anon_unknown_15::ConsoleReporter::log_assert(ConsoleReporter *this,AssertData *rb)

{
  mutex *__mutex;
  int iVar1;
  undefined8 uVar2;
  char *success_str;
  
  if (((rb->m_failed != false) || (this->opt->success == true)) && (this->tc->m_no_output == false))
  {
    __mutex = &this->mutex;
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar1 == 0) {
      logTestStart(this);
      success_str = " ";
      (*(this->super_IReporter)._vptr_IReporter[0xe])(this,rb->m_file,(ulong)(uint)rb->m_line);
      successOrFailColoredStringToStream
                ((ConsoleReporter *)this->s,(bool)(rb->m_failed ^ 1),rb->m_at,success_str);
      fulltext_log_assert_to_stream(this->s,rb);
      log_contexts(this);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return;
    }
    uVar2 = std::__throw_system_error(iVar1);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    _Unwind_Resume(uVar2);
  }
  return;
}

Assistant:

void log_assert(const AssertData& rb) override {
            if((!rb.m_failed && !opt.success) || tc->m_no_output)
                return;

            DOCTEST_LOCK_MUTEX(mutex)

            logTestStart();

            file_line_to_stream(rb.m_file, rb.m_line, " ");
            successOrFailColoredStringToStream(!rb.m_failed, rb.m_at);

            fulltext_log_assert_to_stream(s, rb);

            log_contexts();
        }